

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strspn.c
# Opt level: O2

size_t strspn(char *__s,char *__accept)

{
  char cVar1;
  size_t len;
  char *pcVar2;
  
  len = 0;
  do {
    pcVar2 = __accept;
    if (__s[len] == '\0') {
      return len;
    }
    do {
      cVar1 = *pcVar2;
      if (cVar1 == '\0') {
        return len;
      }
      pcVar2 = pcVar2 + 1;
    } while (__s[len] != cVar1);
    len = len + 1;
  } while( true );
}

Assistant:

size_t strspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[ len ] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p )
            {
                break;
            }

            ++p;
        }

        if ( ! *p )
        {
            return len;
        }

        ++len;
    }

    return len;
}